

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<unsigned_int,_int>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<unsigned_int,_int> *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  int iVar5;
  bool bVar6;
  unsigned_long uVar7;
  idx_t iVar8;
  ulong uVar9;
  bool bVar10;
  uint value;
  uint32_t right;
  uint32_t left;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  
  bVar10 = true;
  if (this->compression_buffer_idx == 0) {
    return true;
  }
  if (this->all_invalid == false) {
    right = this->minimum;
    left = this->maximum;
    if (left != right) goto LAB_01723afe;
  }
  if ((byte)(this->mode - AUTO) < 2) {
    this->total_size = this->total_size + 8;
    return true;
  }
  right = this->minimum;
  left = this->maximum;
LAB_01723afe:
  bVar6 = TrySubtractOperator::Operation<unsigned_int,unsigned_int,unsigned_int>
                    (left,right,&this->min_max_diff);
  this->can_do_for = bVar6;
  CalculateDeltaStats(this);
  if (this->can_do_delta == true) {
    iVar1 = this->minimum_delta;
    if ((this->mode & ~AUTO) != DELTA_FOR && this->maximum_delta == iVar1) {
      this->total_size = this->total_size + 0xc;
      return true;
    }
    uVar2 = this->min_max_diff;
    uVar3 = this->min_max_delta_diff;
    iVar5 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    bVar12 = 0x20 - ((byte)iVar5 ^ 0x1f);
    if (0xfffffff < uVar3) {
      bVar12 = 0x20;
    }
    if (uVar3 == 0) {
      bVar12 = 0;
    }
    iVar5 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    bVar11 = 0x20 - ((byte)iVar5 ^ 0x1f);
    if (0xfffffff < uVar2) {
      bVar11 = 0x20;
    }
    if ((this->mode != FOR && uVar2 != 0) && bVar12 < bVar11) {
      uVar13 = this->compression_buffer_idx;
      if (uVar13 == 0) {
        iVar8 = this->total_size + 0x10;
        uVar13 = 0;
      }
      else {
        uVar9 = 0;
        do {
          this->delta_buffer[uVar9] = this->delta_buffer[uVar9] - iVar1;
          uVar9 = uVar9 + 1;
        } while (uVar13 != uVar9);
        iVar8 = this->total_size + 0x10;
        this->total_size = iVar8;
        if ((uVar13 & 0x1f) != 0) {
          uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar13 & 0x1f);
          uVar13 = (uVar13 - uVar7) + 0x20;
          iVar8 = this->total_size;
        }
      }
      this->total_size = (bVar12 * uVar13 >> 3) + iVar8;
      return true;
    }
  }
  if (this->can_do_for == true) {
    uVar2 = this->min_max_diff;
    uVar3 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar14 = 0x20;
    if (uVar2 < 0x10000000) {
      uVar14 = (uVar3 ^ 0xffffffe0) + 0x21;
    }
    uVar13 = this->compression_buffer_idx;
    if (uVar13 == 0) {
      uVar13 = 0;
    }
    else {
      puVar4 = this->compression_buffer;
      uVar3 = this->minimum;
      uVar9 = 0;
      do {
        puVar4[uVar9] = puVar4[uVar9] - uVar3;
        uVar9 = uVar9 + 1;
      } while (uVar13 != uVar9);
      if ((uVar13 & 0x1f) != 0) {
        uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar13 & 0x1f);
        uVar13 = (uVar13 - uVar7) + 0x20;
      }
    }
    if (uVar2 == 0) {
      uVar14 = 0;
    }
    this->total_size = this->total_size + (uVar14 * uVar13 >> 3) + 0xc;
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}